

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O0

void __thiscall Grid::setup_neighbours(Grid *this)

{
  vector<GridNode_*,_std::allocator<GridNode_*>_> *this_00;
  GridNode *local_40;
  int local_38;
  int local_34;
  int newX;
  int newY;
  int endY;
  int startY;
  int endX;
  int startX;
  GridNode *node;
  int x;
  int y;
  Grid *this_local;
  
  _x = this;
  for (node._4_4_ = 0; node._4_4_ < this->rows; node._4_4_ = node._4_4_ + 1) {
    for (node._0_4_ = 0; (int)node < this->columns; node._0_4_ = (int)node + 1) {
      _endX = get_node_from_position(this,(int)node,node._4_4_);
      startY = clamp((int)node + -1,0,this->columns + -1);
      endY = clamp((int)node + 1,0,this->columns + -1);
      newY = clamp(node._4_4_ + -1,0,this->rows + -1);
      newX = clamp(node._4_4_ + 1,0,this->rows + -1);
      for (local_34 = newY; local_34 <= newX; local_34 = local_34 + 1) {
        for (local_38 = startY; local_38 <= endY; local_38 = local_38 + 1) {
          if ((local_38 != (int)node) || (local_34 != node._4_4_)) {
            this_00 = &_endX->neighbours;
            local_40 = get_node_from_position(this,local_38,local_34);
            std::vector<GridNode_*,_std::allocator<GridNode_*>_>::push_back(this_00,&local_40);
            _endX->neighbourCount = _endX->neighbourCount + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void setup_neighbours()
    {
        for (int y = 0; y < rows; y++)
        {
            for (int x = 0; x < columns; x++)
            {
                GridNode *node = get_node_from_position(x, y);
                int startX = clamp(x - 1, 0, columns - 1);
                int endX = clamp(x + 1, 0, columns - 1);
                int startY = clamp(y - 1, 0, rows - 1);
                int endY = clamp(y + 1, 0, rows - 1);
                for (int newY = startY; newY <= endY; newY++)
                {
                    for (int newX = startX; newX <= endX; newX++)
                    {

                        if (newX != x || newY != y)
                        {
#if DIAGONAL_DISABLED
                            if (newX == x || newY == y)
                            {
                                node->neighbours.push_back(get_node_from_position(newX, newY));
                                node->neighbourCount++;
                            }
#else
                            node->neighbours.push_back(get_node_from_position(newX, newY));
                            node->neighbourCount++;
#endif
                        }
                    }
                }
            }
        }
    }